

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O1

llama_token
try_draft(common_ngram_cache *nc_primary,
         vector<common_ngram,_std::allocator<common_ngram>_> *ngrams_primary,
         common_ngram_cache_part *part_static,int *min_sample_size,int *min_percent)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  uint uVar6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  __node_base_ptr p_Var10;
  _Hash_node_base *p_Var11;
  ulong uVar12;
  __node_base_ptr p_Var13;
  int iVar14;
  __node_base _Var15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  common_ngram ngram_primary;
  common_ngram_cache_part part_primary;
  int local_b4;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_> local_80
  ;
  key_type local_78;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  uVar6 = (int)((ulong)((long)(ngrams_primary->
                              super__Vector_base<common_ngram,_std::allocator<common_ngram>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ngrams_primary->
                             super__Vector_base<common_ngram,_std::allocator<common_ngram>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
  if ((int)uVar6 < 0) {
    local_b4 = -1;
  }
  else {
    uVar16 = (ulong)uVar6;
    do {
      pcVar1 = (ngrams_primary->super__Vector_base<common_ngram,_std::allocator<common_ngram>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar16;
      local_78.tokens._0_8_ = *(undefined8 *)pcVar1->tokens;
      local_78.tokens._8_8_ = *(undefined8 *)(pcVar1->tokens + 2);
      iVar9 = std::
              _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&nc_primary->_M_h,&local_78);
      local_b4 = -1;
      if (iVar9.
          super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        iVar18 = 0;
        local_68._M_buckets = (__buckets_ptr)0x0;
        local_68._M_bucket_count =
             *(size_type *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x20);
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count =
             *(size_type *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x30);
        local_68._M_rehash_policy._0_8_ =
             *(undefined8 *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x38);
        local_68._M_rehash_policy._M_next_resize =
             *(size_t *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                     ._M_cur + 0x40);
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        local_80._M_h = (__hashtable_alloc *)&local_68;
        std::
        _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                  ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)local_80._M_h,
                   (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                             ._M_cur + 0x18),&local_80);
        local_b4 = -1;
        iVar14 = -1;
        iVar8 = 0;
        if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          uVar4 = (part_static->_M_h)._M_bucket_count;
          iVar8 = 0;
          iVar17 = 0;
          iVar18 = 0;
          _Var15._M_nxt = local_68._M_before_begin._M_nxt;
          do {
            iVar2 = *(int *)&_Var15._M_nxt[1]._M_nxt;
            iVar3 = *(int *)((long)&_Var15._M_nxt[1]._M_nxt + 4);
            uVar12 = (ulong)(long)iVar2 % uVar4;
            p_Var5 = (part_static->_M_h)._M_buckets[uVar12];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var5 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var5, p_Var13 = p_Var5->_M_nxt,
               iVar2 != *(int *)&p_Var5->_M_nxt[1]._M_nxt)) {
              while (p_Var11 = p_Var13->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)(long)*(int *)&p_Var11[1]._M_nxt % uVar4 != uVar12) ||
                   (p_Var10 = p_Var13, p_Var13 = p_Var11, iVar2 == *(int *)&p_Var11[1]._M_nxt))
                goto LAB_0021065d;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_0021065d:
            if (p_Var10 == (__node_base_ptr)0x0) {
              p_Var11 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var11 = p_Var10->_M_nxt;
            }
            if (p_Var11 == (_Hash_node_base *)0x0) {
              iVar7 = 1;
            }
            else {
              iVar7 = *(int *)((long)&p_Var11[1]._M_nxt + 4) * 100;
            }
            if (iVar8 * iVar17 < iVar7 * iVar3) {
              iVar8 = iVar3;
              iVar14 = iVar2;
              iVar17 = iVar7;
            }
            iVar18 = iVar18 + iVar3;
            _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt;
          } while (_Var15._M_nxt != (_Hash_node_base *)0x0);
          iVar8 = iVar8 * 100;
        }
        if ((min_sample_size[uVar16] <= iVar18) &&
           (local_b4 = iVar14, iVar8 < iVar18 * min_percent[uVar16])) {
          local_b4 = -1;
        }
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_68);
      }
    } while ((0 < (long)uVar16) && (uVar16 = uVar16 - 1, local_b4 == -1));
  }
  return local_b4;
}

Assistant:

static llama_token try_draft(
    common_ngram_cache & nc_primary, const std::vector<common_ngram> & ngrams_primary, common_ngram_cache_part & part_static,
    const int * min_sample_size, const int * min_percent) {

    llama_token drafted_token = LLAMA_TOKEN_NULL;

    for (int i = ngrams_primary.size()-1; i >= 0 && drafted_token == LLAMA_TOKEN_NULL; --i) {
        const common_ngram ngram_primary = ngrams_primary[i];

        common_ngram_cache::iterator part_primary_it = nc_primary.find(ngram_primary);
        if (part_primary_it == nc_primary.end()) {
            continue;
        }
        const common_ngram_cache_part part_primary = part_primary_it->second;

        int max_count_primary = 0;
        int max_count_static  = 0;
        int sum_count_primary = 0;
        llama_token max_token = LLAMA_TOKEN_NULL;

        for (std::pair<llama_token, int> token_count_primary : part_primary) {
            const llama_token token = token_count_primary.first;

            common_ngram_cache_part::iterator token_count_static_it = part_static.find(token);

            const int32_t count_primary = token_count_primary.second;
            const int32_t count_static  = token_count_static_it != part_static.end() ? 100*token_count_static_it->second : 1;

            if (count_primary*count_static > max_count_primary*max_count_static) {
                max_token         = token;
                max_count_primary = count_primary;
                max_count_static  = count_static;
            }
            sum_count_primary += count_primary;
        }

        if (sum_count_primary < min_sample_size[i]) {
            continue;
        }
        if (100*max_count_primary < min_percent[i]*sum_count_primary) {
            continue;;
        }
        drafted_token = max_token;
    }

    return drafted_token;
}